

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_rand.cc
# Opt level: O3

cpp_gen * new_normal_gen(void)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  undefined4 *puVar4;
  cpp_gen *pcVar5;
  size_t __i;
  long lVar6;
  random_device rd;
  random_device local_13a0;
  
  std::random_device::random_device(&local_13a0);
  puVar2 = (ulong *)operator_new(5000);
  uVar1 = std::random_device::_M_getval();
  uVar3 = (ulong)uVar1;
  *puVar2 = uVar3;
  lVar6 = 1;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar6);
    puVar2[lVar6] = uVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  puVar2[0x270] = 0x270;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0x3ff00000;
  *(undefined8 *)(puVar4 + 4) = 0;
  *(undefined1 *)(puVar4 + 6) = 0;
  pcVar5 = (cpp_gen *)operator_new(0x10);
  pcVar5->d = puVar4;
  pcVar5->gen = puVar2;
  std::random_device::_M_fini();
  return pcVar5;
}

Assistant:

struct cpp_gen *new_normal_gen() {
		std::random_device rd {};
		std::mt19937 *gen = new std::mt19937(rd());
		std::normal_distribution<double> *d = new std::normal_distribution<double>();
		struct cpp_gen *ng = new struct cpp_gen;
		ng->d = d;
		ng->gen = gen;

		return ng;
	}